

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_butcher.c
# Opt level: O0

ARKodeButcherTable ARKodeButcherTable_Copy(ARKodeButcherTable B)

{
  int iVar1;
  long lVar2;
  int *in_RDI;
  int embedded;
  ARKodeButcherTable Bcopy;
  int s;
  int j;
  int i;
  undefined8 in_stack_ffffffffffffffd8;
  int local_18;
  int local_14;
  ARKodeButcherTable local_8;
  
  if (in_RDI == (int *)0x0) {
    local_8 = (ARKodeButcherTable)0x0;
  }
  else {
    iVar1 = in_RDI[2];
    lVar2 = *(long *)(in_RDI + 10);
    local_8 = ARKodeButcherTable_Alloc
                        ((int)((ulong)in_stack_ffffffffffffffd8 >> 0x20),
                         (int)in_stack_ffffffffffffffd8);
    if (local_8 == (ARKodeButcherTable)0x0) {
      local_8 = (ARKodeButcherTable)0x0;
    }
    else {
      local_8->stages = in_RDI[2];
      local_8->q = *in_RDI;
      local_8->p = in_RDI[1];
      for (local_14 = 0; local_14 < iVar1; local_14 = local_14 + 1) {
        local_8->c[local_14] = *(realtype *)(*(long *)(in_RDI + 6) + (long)local_14 * 8);
        local_8->b[local_14] = *(realtype *)(*(long *)(in_RDI + 8) + (long)local_14 * 8);
        for (local_18 = 0; local_18 < iVar1; local_18 = local_18 + 1) {
          local_8->A[local_14][local_18] =
               *(realtype *)
                (*(long *)(*(long *)(in_RDI + 4) + (long)local_14 * 8) + (long)local_18 * 8);
        }
      }
      if (lVar2 != 0) {
        for (local_14 = 0; local_14 < iVar1; local_14 = local_14 + 1) {
          local_8->d[local_14] = *(realtype *)(*(long *)(in_RDI + 10) + (long)local_14 * 8);
        }
      }
    }
  }
  return local_8;
}

Assistant:

ARKodeButcherTable ARKodeButcherTable_Copy(ARKodeButcherTable B)
{
  int i, j, s;
  ARKodeButcherTable Bcopy;
  booleantype embedded;

  /* Check for legal input */
  if (B == NULL) return(NULL);

  /* Get the number of stages */
  s = B->stages;

  /* Does the table have an embedding? */
  embedded = (B->d != NULL) ? SUNTRUE : SUNFALSE;

  /* Allocate Butcher table structure */
  Bcopy = ARKodeButcherTable_Alloc(s, embedded);
  if (Bcopy == NULL) return(NULL);

  /* set the relevant parameters */
  Bcopy->stages = B->stages;
  Bcopy->q = B->q;
  Bcopy->p = B->p;

  /* Copy Butcher table */
  for (i=0; i<s; i++) {
    Bcopy->c[i] = B->c[i];
    Bcopy->b[i] = B->b[i];
    for (j=0; j<s; j++) {
      Bcopy->A[i][j] = B->A[i][j];
    }
  }

  if (embedded)
    for (i=0; i<s; i++)
      Bcopy->d[i] = B->d[i];

  return(Bcopy);
}